

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

char * getattrib(rnndb *db,char *file,int line,xmlAttr *attr)

{
  long in_RCX;
  uint in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  xmlNode *chain;
  long local_30;
  
  local_30 = *(long *)(in_RCX + 0x18);
  while( true ) {
    if (local_30 == 0) {
      return "";
    }
    if (*(int *)(local_30 + 8) == 3) break;
    fprintf(_stderr,"%s:%d: unknown attribute child \"%s\" in attribute \"%s\"\n",in_RSI,
            (ulong)in_EDX,*(undefined8 *)(local_30 + 0x10),*(undefined8 *)(in_RCX + 0x10));
    *(undefined4 *)(in_RDI + 0x80) = 1;
    local_30 = *(long *)(local_30 + 0x30);
  }
  return *(char **)(local_30 + 0x50);
}

Assistant:

static char *getattrib (struct rnndb *db, char *file, int line, xmlAttr *attr) {
	xmlNode *chain = attr->children;
	while (chain) {
		if (chain->type != XML_TEXT_NODE) {
			fprintf (stderr, "%s:%d: unknown attribute child \"%s\" in attribute \"%s\"\n", file, line, chain->name, attr->name);
			db->estatus = 1;
		} else {
			return chain->content;
		}
		chain = chain->next;
	}
	return "";
}